

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O1

_Bool effect_handler_LASH(effect_handler_context_t *context)

{
  wchar_t wVar1;
  wchar_t typ;
  monster_blow *pmVar2;
  _Bool _Var3;
  _Bool _Var4;
  wchar_t dam;
  int iVar5;
  wchar_t wVar6;
  monster *mon;
  monster *pmVar7;
  loc finish;
  wchar_t rad;
  ulong uVar8;
  long lVar9;
  random_value v;
  source origin;
  
  _Var3 = false;
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  wVar1 = context->radius;
  loc(-1,-1);
  if ((context->origin).what == SRC_MONSTER) {
    mon = cave_monster(cave,(context->origin).which.monster);
    pmVar7 = monster_target_monster((effect_handler_context_t_conflict *)context);
    if (pmVar7 == (monster *)0x0) {
      _Var3 = monster_is_decoyed(mon);
      if (_Var3) {
        finish = cave_find_decoy(cave);
      }
      else {
        finish.x = (player->grid).x;
        finish.y = (player->grid).y;
      }
    }
    else {
      finish.x = (pmVar7->grid).x;
      finish.y = (pmVar7->grid).y;
    }
    rad = (uint)z_info->max_range;
    if (wVar1 < (int)(uint)z_info->max_range) {
      rad = wVar1;
    }
    typ = mon->race->blow->effect->lash_type;
    if (z_info->mon_blows_max != 0) {
      lVar9 = 0;
      uVar8 = 0;
      do {
        pmVar2 = mon->race->blow;
        v._8_8_ = *(undefined8 *)((long)&(pmVar2->dice).sides + lVar9);
        v._0_8_ = *(undefined8 *)((long)&(pmVar2->dice).base + lVar9);
        iVar5 = randcalc(v,mon->race->level,RANDOMISE);
        dam = iVar5 / (int)(2 - (uint)(lVar9 == 0)) + dam;
        if (*(long *)((long)&mon->race->blow->next + lVar9) == 0) break;
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + 0x30;
      } while (uVar8 < z_info->mon_blows_max);
    }
    if (dam == L'\0') {
      _Var3 = false;
    }
    else {
      wVar6 = L'\x19';
      if (wVar1 < L'\x19') {
        wVar6 = wVar1;
      }
      origin._4_4_ = 0;
      origin.what = (context->origin).what;
      origin.which.trap = (context->origin).which.trap;
      _Var4 = project(origin,rad,finish,dam,typ,L'౰',L'\0',(uint8_t)wVar6,context->obj);
      _Var3 = true;
      if (_Var4) {
        context->ident = true;
      }
    }
  }
  return _Var3;
}

Assistant:

bool effect_handler_LASH(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, false);
	int rad = context->radius;

	int flg = PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL | PROJECT_ARC;
	int type;

	struct loc target = loc(-1, -1);

	/* Diameter of source is the same as the radius, so the effect is
	 * essentially full strength for its entire length. */
	int diameter_of_source = rad;

	/* Monsters only */
	if (context->origin.what == SRC_MONSTER) {
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		struct monster *t_mon = monster_target_monster(context);
		int i;

		flg |= PROJECT_PLAY;

		/* Target player or monster? */
		if (t_mon) {
			target = t_mon->grid;
		} else {
			if (monster_is_decoyed(mon)) {
				target = cave_find_decoy(cave);
			} else {
				target = player->grid;
			}
		}

		/* Paranoia */
		if (rad > z_info->max_range) rad = z_info->max_range;

		/* Get the type (default is PROJ_MISSILE) */
		type = mon->race->blow[0].effect->lash_type;

		/* Scan through all blows for damage */
		for (i = 0; i < z_info->mon_blows_max; i++) {
			/* Extract the attack infomation */
			random_value dice = mon->race->blow[i].dice;

			/* Full damage of first blow, plus half damage of others */
			dam += randcalc(dice, mon->race->level, RANDOMISE) / (i ? 2 : 1);
			if (!mon->race->blow[i].next) break;
		}

		/* No damaging blows */
		if (!dam) return false;
	} else {
		return false;
	}

	/* Check bounds */
	if (diameter_of_source > 25) {
		diameter_of_source = 25;
	}

	/* Lash the target */
	if (project(context->origin, rad, target, dam, type, flg, 0,
				diameter_of_source, context->obj)) {
		context->ident = true;
	}

	return true;
}